

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JXS.cpp
# Opt level: O0

MXFWriter * __thiscall
AS_02::JXS::MXFWriter::OpenWrite
          (MXFWriter *this,string *filename,WriterInfo *Info,
          GenericPictureEssenceDescriptor *picture_descriptor,
          JPEGXSPictureSubDescriptor *jxs_sub_descriptor,Rational *edit_rate,ui32_t *header_size,
          IndexStrategy_t *strategy,ui32_t *partition_space)

{
  GenericPictureEssenceDescriptor *pGVar1;
  int iVar2;
  h__Writer *phVar3;
  Dictionary *d;
  size_type *this_00;
  ui32_t *in_stack_00000020;
  undefined1 local_b0 [128];
  JPEGXSPictureSubDescriptor *jxs_sub_descriptor_local;
  GenericPictureEssenceDescriptor *picture_descriptor_local;
  WriterInfo *Info_local;
  string *filename_local;
  MXFWriter *this_local;
  Result_t *result;
  
  local_b0._120_8_ = edit_rate;
  jxs_sub_descriptor_local = jxs_sub_descriptor;
  picture_descriptor_local = picture_descriptor;
  Info_local = Info;
  filename_local = filename;
  this_local = this;
  phVar3 = (h__Writer *)operator_new(0x5c0);
  d = (Dictionary *)ASDCP::DefaultSMPTEDict();
  h__Writer::h__Writer(phVar3,d);
  this_00 = &filename->_M_string_length;
  ASDCP::mem_ptr<AS_02::JXS::MXFWriter::h__Writer>::operator=
            ((mem_ptr<AS_02::JXS::MXFWriter::h__Writer> *)this_00,phVar3);
  pGVar1 = picture_descriptor_local;
  phVar3 = ASDCP::mem_ptr<AS_02::JXS::MXFWriter::h__Writer>::operator->
                     ((mem_ptr<AS_02::JXS::MXFWriter::h__Writer> *)this_00);
  ASDCP::WriterInfo::operator=
            (&(phVar3->super_h__AS02WriterFrame).super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>
              .super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_Info,(WriterInfo *)pGVar1);
  local_b0[0x6b] = 0;
  phVar3 = ASDCP::mem_ptr<AS_02::JXS::MXFWriter::h__Writer>::operator->
                     ((mem_ptr<AS_02::JXS::MXFWriter::h__Writer> *)this_00);
  h__Writer::OpenWrite
            ((h__Writer *)this,(string *)phVar3,(GenericPictureEssenceDescriptor *)Info_local,
             jxs_sub_descriptor_local,(IndexStrategy_t *)local_b0._120_8_,partition_space,
             in_stack_00000020);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    phVar3 = ASDCP::mem_ptr<AS_02::JXS::MXFWriter::h__Writer>::operator->
                       ((mem_ptr<AS_02::JXS::MXFWriter::h__Writer> *)&filename->_M_string_length);
    h__Writer::SetSourceStream
              ((h__Writer *)local_b0,(string *)phVar3,(Rational *)&JXS_PACKAGE_LABEL_abi_cxx11_);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b0);
    Kumu::Result_t::~Result_t((Result_t *)local_b0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar2 < 0) {
    ASDCP::mem_ptr<AS_02::JXS::MXFWriter::h__Writer>::release
              ((mem_ptr<AS_02::JXS::MXFWriter::h__Writer> *)&filename->_M_string_length);
  }
  return this;
}

Assistant:

Result_t
AS_02::JXS::MXFWriter::OpenWrite(const std::string& filename, const ASDCP::WriterInfo& Info,
                                 ASDCP::MXF::GenericPictureEssenceDescriptor& picture_descriptor,
                                 ASDCP::MXF::JPEGXSPictureSubDescriptor& jxs_sub_descriptor,
                                 const ASDCP::Rational& edit_rate, const ui32_t& header_size,
                                 const IndexStrategy_t& strategy, const ui32_t& partition_space)
{
  m_Writer = new AS_02::JXS::MXFWriter::h__Writer(&DefaultSMPTEDict());
  m_Writer->m_Info = Info;

  Result_t result = m_Writer->OpenWrite(filename, picture_descriptor, jxs_sub_descriptor,
					strategy, partition_space, header_size);

  if ( KM_SUCCESS(result) )
    result = m_Writer->SetSourceStream(JXS_PACKAGE_LABEL, edit_rate);

  if ( KM_FAILURE(result) )
    m_Writer.release();

  return result;
}